

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_vector(uchar **strings,size_t n)

{
  byte bVar1;
  ulong uVar2;
  ostream *poVar3;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  pointer ppvVar4;
  undefined8 *puVar5;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *this;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  ulong uVar6;
  long lVar7;
  uint index;
  byte *pbVar8;
  _func_void_uchar_ptr_ptr_int_int *p_Var9;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"pseudo_sample",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): sampling ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," strings ...\n",0xd);
  root = (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
         )operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (n != 0) {
    lVar7 = 5000;
    uVar6 = 0;
    do {
      pbVar8 = strings[uVar6];
      this = root;
      if (pbVar8 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      while( true ) {
        bVar1 = *pbVar8;
        if (bVar1 == 0) break;
        ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
        if (in_RCX < (_func_void_uchar_ptr_ptr_int_int *)((ulong)bVar1 + 1)) {
          std::vector<void_*,_std::allocator<void_*>_>::resize
                    (&this->_buckets,(size_type)((ulong)bVar1 + 1));
          ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
        }
        index = (uint)bVar1;
        p_Var9 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)index;
        if ((in_RCX <= p_Var9) || (((ulong)ppvVar4[(long)p_Var9] & 1) == 0)) {
          puVar5 = (undefined8 *)operator_new(0x18);
          *puVar5 = 0;
          puVar5[1] = 0;
          puVar5[2] = 0;
          *(undefined8 **)
           ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(index * 8)) = puVar5;
          ppvVar4 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar2 = *(ulong *)((long)ppvVar4 + (ulong)(index * 8));
          if (uVar2 == 0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(uVar2 | 1);
          ppvVar4[(long)p_Var9] = in_RCX;
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) goto LAB_00210872;
        }
        this = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
               ::get_node(this,index);
        pbVar8 = pbVar8 + 1;
        if (this == (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                     *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = std::vector<unsigned char *>]"
                       );
        }
      }
      uVar6 = uVar6 + 0x2000;
    } while (uVar6 < n);
  }
LAB_00210872:
  insert<8192u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (root,strings,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_vector(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<8192, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}